

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * Strsafe(char *y)

{
  char *__dest;
  size_t sVar1;
  
  if (y == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = Strsafe_find(y);
    if (__dest == (char *)0x0) {
      sVar1 = strlen(y);
      __dest = (char *)malloc((long)((int)sVar1 + 1));
      if (__dest == (char *)0x0) {
        memory_error();
      }
      strcpy(__dest,y);
      Strsafe_insert(__dest);
    }
  }
  return __dest;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}